

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::
step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)1>_>
          (xpath_ast_node *this,xml_node_struct *ns,undefined8 *xn,undefined8 param_4,byte once)

{
  xml_node_struct *parent;
  bool bVar1;
  xpath_allocator *alloc;
  
  alloc = (xpath_allocator *)*xn;
  parent = (xml_node_struct *)xn[1];
  if (alloc == (xpath_allocator *)0x0 || parent != (xml_node_struct *)0x0) {
    if ((alloc != (xpath_allocator *)0x0 && parent != (xml_node_struct *)0x0) &&
       ((this->_test != '\x02' ||
        (bVar1 = step_push((xpath_ast_node *)0x2,(xpath_node_set_raw *)(this->_data).variable,
                           (xml_attribute_struct *)ns,parent,alloc), (bVar1 & once) == 0)))) {
      do {
        bVar1 = step_push((xpath_ast_node *)(ulong)(byte)this->_test,
                          (xpath_node_set_raw *)(this->_data).variable,ns,alloc);
        if ((bVar1 & once) != 0) {
          return;
        }
        alloc = (xpath_allocator *)alloc[1]._root;
      } while (alloc != (xpath_allocator *)0x0);
    }
  }
  else {
    do {
      bVar1 = step_push((xpath_ast_node *)(ulong)(byte)this->_test,
                        (xpath_node_set_raw *)(this->_data).variable,ns,alloc);
      if ((bVar1 & once) != 0) {
        return;
      }
      alloc = (xpath_allocator *)alloc[1]._root;
    } while (alloc != (xpath_allocator *)0x0);
  }
  return;
}

Assistant:

void step_fill(xpath_node_set_raw& ns, const xpath_node& xn, xpath_allocator* alloc, bool once, T v)
		{
			const axis_t axis = T::axis;
			const bool axis_has_attributes = (axis == axis_ancestor || axis == axis_ancestor_or_self || axis == axis_descendant_or_self || axis == axis_following || axis == axis_parent || axis == axis_preceding || axis == axis_self);

			if (xn.node())
				step_fill(ns, xn.node().internal_object(), alloc, once, v);
			else if (axis_has_attributes && xn.attribute() && xn.parent())
				step_fill(ns, xn.attribute().internal_object(), xn.parent().internal_object(), alloc, once, v);
		}